

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint64_t roaring_bitmap_and_cardinality(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int iVar1;
  int iVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  int iVar5;
  int iVar6;
  uint64_t uVar7;
  uint uVar8;
  uint uVar9;
  ushort uVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  
  iVar1 = (x1->high_low_container).size;
  iVar2 = (x2->high_low_container).size;
  uVar15 = 0;
  if (iVar2 < 1 || iVar1 < 1) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    uVar13 = 0;
    do {
      puVar3 = (x1->high_low_container).keys;
      uVar14 = (uint)uVar15;
      uVar8 = uVar14 & 0xffff;
      uVar10 = puVar3[uVar8];
      puVar4 = (x2->high_low_container).keys;
      uVar12 = (uint)uVar13;
      uVar9 = uVar12 & 0xffff;
      uVar11 = puVar4[uVar9];
      if (uVar10 == uVar11) {
        iVar6 = container_and_cardinality
                          ((x1->high_low_container).containers[uVar8],
                           (x1->high_low_container).typecodes[uVar8],
                           (x2->high_low_container).containers[uVar9],
                           (x2->high_low_container).typecodes[uVar9]);
        uVar7 = uVar7 + (long)iVar6;
        uVar15 = (ulong)(uVar14 + 1);
        uVar13 = (ulong)(uVar12 + 1);
      }
      else if (uVar10 < uVar11) {
        uVar12 = (x1->high_low_container).size;
        uVar8 = uVar14 + 1;
        if (((int)uVar8 < (int)uVar12) && (puVar3[(int)uVar8] < uVar11)) {
          uVar14 = uVar14 + 2;
          iVar6 = 1;
          if ((int)uVar14 < (int)uVar12) {
            iVar6 = 1;
            do {
              uVar15 = (ulong)uVar14;
              uVar10 = puVar3[(int)uVar14];
              if (uVar11 <= uVar10) goto LAB_001219bc;
              iVar5 = iVar6 * 2;
              uVar14 = uVar8 + iVar6 * 2;
              iVar6 = iVar5;
            } while ((int)uVar14 < (int)uVar12);
          }
          uVar10 = puVar3[(long)(int)uVar12 + -1];
          uVar15 = (long)(int)uVar12 - 1;
LAB_001219bc:
          if (uVar10 != uVar11) {
            if (uVar10 < uVar11) {
              uVar15 = (ulong)uVar12;
            }
            else if ((iVar6 >> 1) + uVar8 + 1 != (int)uVar15) {
              uVar8 = (iVar6 >> 1) + uVar8;
              do {
                uVar14 = (int)(uVar8 + (int)uVar15) >> 1;
                if (puVar3[(int)uVar14] == uVar11) {
                  uVar15 = (ulong)uVar14;
                  break;
                }
                if (uVar11 <= puVar3[(int)uVar14]) {
                  uVar15 = (ulong)uVar14;
                  uVar14 = uVar8;
                }
                uVar8 = uVar14;
              } while (uVar8 + 1 != (int)uVar15);
            }
          }
        }
        else {
          uVar15 = (ulong)uVar8;
        }
      }
      else {
        uVar14 = (x2->high_low_container).size;
        uVar8 = uVar12 + 1;
        if (((int)uVar8 < (int)uVar14) && (puVar4[(int)uVar8] < uVar10)) {
          uVar12 = uVar12 + 2;
          iVar6 = 1;
          if ((int)uVar12 < (int)uVar14) {
            iVar6 = 1;
            do {
              uVar13 = (ulong)uVar12;
              uVar11 = puVar4[(int)uVar12];
              if (uVar10 <= uVar11) goto LAB_00121a25;
              iVar5 = iVar6 * 2;
              uVar12 = uVar8 + iVar6 * 2;
              iVar6 = iVar5;
            } while ((int)uVar12 < (int)uVar14);
          }
          uVar11 = puVar4[(long)(int)uVar14 + -1];
          uVar13 = (long)(int)uVar14 - 1;
LAB_00121a25:
          if (uVar11 != uVar10) {
            if (uVar11 < uVar10) {
              uVar13 = (ulong)uVar14;
            }
            else if ((iVar6 >> 1) + uVar8 + 1 != (int)uVar13) {
              uVar8 = (iVar6 >> 1) + uVar8;
              do {
                uVar14 = (int)(uVar8 + (int)uVar13) >> 1;
                if (puVar4[(int)uVar14] == uVar10) {
                  uVar13 = (ulong)uVar14;
                  break;
                }
                if (uVar10 <= puVar4[(int)uVar14]) {
                  uVar13 = (ulong)uVar14;
                  uVar14 = uVar8;
                }
                uVar8 = uVar14;
              } while (uVar8 + 1 != (int)uVar13);
            }
          }
        }
        else {
          uVar13 = (ulong)uVar8;
        }
      }
    } while (((int)uVar15 < iVar1) && ((int)uVar13 < iVar2));
  }
  return uVar7;
}

Assistant:

uint64_t roaring_bitmap_and_cardinality(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            answer += container_and_cardinality(c1, type1, c2, type2);
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}